

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

void __thiscall
HighsLpRelaxation::removeCuts
          (HighsLpRelaxation *this,HighsInt ndelcuts,vector<int,_std::allocator<int>_> *deletemask)

{
  Highs *this_00;
  int iVar1;
  pointer pcVar2;
  pointer pLVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  pointer piVar7;
  long lVar8;
  int iVar9;
  HighsBasis basis;
  undefined1 local_b0 [16];
  _Alloc_hider local_a0;
  char *local_98;
  char local_90 [16];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_80;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_68;
  string local_50;
  
  if (0 < ndelcuts) {
    local_b0._8_4_ = (this->lpsolver).basis_.debug_update_count;
    local_b0[0] = (this->lpsolver).basis_.valid;
    local_b0[1] = (this->lpsolver).basis_.alien;
    local_b0[2] = (this->lpsolver).basis_.useful;
    local_b0[3] = (this->lpsolver).basis_.was_alien;
    local_b0._4_4_ = (this->lpsolver).basis_.debug_id;
    local_a0._M_p = local_90;
    pcVar2 = (this->lpsolver).basis_.debug_origin_name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,
               pcVar2 + (this->lpsolver).basis_.debug_origin_name._M_string_length);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
              (&local_80,&(this->lpsolver).basis_.col_status);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
              (&local_68,&(this->lpsolver).basis_.row_status);
    this_00 = &this->lpsolver;
    iVar9 = (this->lpsolver).model_.lp_.num_row_;
    Highs::deleteRows(this_00,(deletemask->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start);
    iVar1 = this->mipsolver->model_->num_row_;
    lVar5 = (long)iVar1;
    if (iVar9 != iVar1) {
      piVar7 = (deletemask->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar5 * 0xc;
      iVar9 = iVar9 - iVar1;
      do {
        lVar8 = (long)piVar7[lVar5];
        if (-1 < lVar8) {
          pLVar3 = (this->lprows).
                   super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar3[lVar8].age = *(HighsInt *)((long)&pLVar3->age + lVar6);
          uVar4 = *(undefined8 *)((long)&pLVar3->origin + lVar6);
          pLVar3[lVar8].origin = (int)uVar4;
          pLVar3[lVar8].index = (int)((ulong)uVar4 >> 0x20);
          piVar7 = (deletemask->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_68.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[piVar7[lVar5]] =
               local_68.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar5];
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0xc;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&local_68,
               (long)local_68.
                     super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(local_68.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start + (uint)ndelcuts));
    std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::resize
              (&this->lprows,
               ((long)(this->lprows).
                      super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->lprows).
                      super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
               (ulong)(uint)ndelcuts);
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,0x3ce2d4);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    Highs::setBasis(this_00,(HighsBasis *)local_b0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x39);
    Highs::run(this_00);
    HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0x39);
    if (local_68.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a0._M_p != local_90) {
      operator_delete(local_a0._M_p);
    }
  }
  return;
}

Assistant:

void HighsLpRelaxation::removeCuts(HighsInt ndelcuts,
                                   std::vector<HighsInt>& deletemask) {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  if (ndelcuts > 0) {
    HighsBasis basis = lpsolver.getBasis();
    HighsInt nlprows = lpsolver.getNumRow();
    lpsolver.deleteRows(deletemask.data());
    for (HighsInt i = mipsolver.numRow(); i != nlprows; ++i) {
      if (deletemask[i] >= 0) {
        lprows[deletemask[i]] = lprows[i];
        basis.row_status[deletemask[i]] = basis.row_status[i];
      }
    }

    assert(lpsolver.getLp().num_row_ ==
           (HighsInt)lpsolver.getLp().row_lower_.size());

    basis.row_status.resize(basis.row_status.size() - ndelcuts);
    lprows.resize(lprows.size() - ndelcuts);

    assert(lpsolver.getLp().num_row_ == (HighsInt)lprows.size());
    basis.debug_origin_name = "HighsLpRelaxation::removeCuts";
    lpsolver.setBasis(basis);
    mipsolver.analysis_.mipTimerStart(kMipClockSimplexBasisSolveLp);
    lpsolver.run();
    mipsolver.analysis_.mipTimerStop(kMipClockSimplexBasisSolveLp);
  }
}